

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse.c
# Opt level: O0

void mod2sparse_copycols(mod2sparse *m,mod2sparse *r,int *cols)

{
  long in_RDX;
  mod2sparse *in_RSI;
  mod2sparse *in_RDI;
  int j;
  mod2entry *e;
  int local_24;
  mod2entry *local_20;
  
  if (in_RSI->n_rows < in_RDI->n_rows) {
    fprintf(_stderr,"mod2sparse_copycols: Destination matrix has fewer rows than source\n");
    exit(1);
  }
  mod2sparse_clear(in_RSI);
  local_24 = 0;
  while( true ) {
    if (in_RSI->n_cols <= local_24) {
      return;
    }
    if ((*(int *)(in_RDX + (long)local_24 * 4) < 0) ||
       (in_RDI->n_cols <= *(int *)(in_RDX + (long)local_24 * 4))) break;
    for (local_20 = in_RDI->cols[*(int *)(in_RDX + (long)local_24 * 4)].down; -1 < local_20->row;
        local_20 = local_20->down) {
      mod2sparse_insert(in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
    }
    local_24 = local_24 + 1;
  }
  fprintf(_stderr,"mod2sparse_copycols: Column index out of range\n");
  exit(1);
}

Assistant:

void mod2sparse_copycols
( mod2sparse *m,	/* Matrix to copy */
  mod2sparse *r,	/* Place to store copy of matrix */
  int *cols		/* Indexes of columns to copy, from 0 */
)
{ 
  mod2entry *e;
  int j;

  if (mod2sparse_rows(m)>mod2sparse_rows(r))
  { fprintf(stderr,
      "mod2sparse_copycols: Destination matrix has fewer rows than source\n");
    exit(1);
  }

  mod2sparse_clear(r);

  for (j = 0; j<mod2sparse_cols(r); j++)
  { if (cols[j]<0 || cols[j]>=mod2sparse_cols(m))
    { fprintf(stderr,"mod2sparse_copycols: Column index out of range\n");
      exit(1);
    }
    e = mod2sparse_first_in_col(m,cols[j]);
    while (!mod2sparse_at_end(e))
    { mod2sparse_insert(r,e->row,j);
      e = mod2sparse_next_in_col(e);
    }
  }
}